

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_statemach_act(connectdata *conn)

{
  anon_union_224_10_26c073a1_for_proto *pp;
  int *piVar1;
  curl_off_t *pcVar2;
  byte bVar3;
  curl_socket_t sockfd;
  curl_usessl cVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  CURLcode CVar8;
  _Bool _Var9;
  CURLcode CVar10;
  uint uVar11;
  int iVar12;
  size_t sVar13;
  size_t sVar14;
  ulong uVar15;
  char *pcVar16;
  int writesockindex;
  SessionHandle *pSVar17;
  char *pcVar18;
  bool bVar19;
  int imapcode;
  size_t nread;
  int local_74;
  ulong local_70;
  undefined8 local_68;
  ulong local_48;
  SASL *local_40;
  size_t local_38;
  
  sockfd = conn->sock[0];
  local_38 = 0;
  CVar10 = CURLE_NOT_BUILT_IN;
  if ((conn->proto).imapc.state != IMAP_UPGRADETLS) {
    pp = &conn->proto;
    if ((conn->proto).ftpc.pp.sendleft != 0) {
      CVar10 = Curl_pp_flushsend(&(pp->ftpc).pp);
      return CVar10;
    }
    local_40 = &(conn->proto).imapc.sasl;
    while (CVar10 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,&local_74,&local_38), CVar10 == CURLE_OK)
    {
      if (local_74 == -1) {
        return CURLE_FTP_WEIRD_SERVER_REPLY;
      }
      if (local_74 == 0) {
        return CURLE_OK;
      }
      switch((conn->proto).imapc.state) {
      case IMAP_SERVERGREET:
        if (local_74 == 0x4f) {
          (conn->proto).ftpc.diralloc = 0;
          *(undefined4 *)((long)&conn->proto + 0x8c) = 0;
          (conn->proto).imapc.tls_supported = false;
          CVar10 = imap_sendf(conn,"CAPABILITY");
          if (CVar10 == CURLE_OK) {
            (conn->proto).imapc.state = IMAP_CAPABILITY;
          }
        }
        else {
          Curl_failf(conn->data,"Got unexpected imap-server response");
          CVar10 = CURLE_FTP_WEIRD_SERVER_REPLY;
        }
        break;
      case IMAP_CAPABILITY:
        pSVar17 = conn->data;
        if (local_74 == 0x4f) {
          cVar4 = (pSVar17->set).use_ssl;
          if ((cVar4 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
            if ((conn->proto).imapc.tls_supported == true) {
              CVar10 = imap_sendf(conn,"STARTTLS");
              if (CVar10 == CURLE_OK) {
                (conn->proto).imapc.state = IMAP_STARTTLS;
              }
              break;
            }
            if (cVar4 != CURLUSESSL_TRY) {
              Curl_failf(pSVar17,"STARTTLS not supported.");
              goto LAB_004db366;
            }
          }
        }
        else if (local_74 == 0x2a) {
          pcVar18 = (pSVar17->state).buffer + 2;
          do {
            for (; uVar15 = (ulong)(byte)*pcVar18, 0x20 < uVar15; pcVar18 = pcVar18 + sVar14) {
LAB_004db409:
              uVar15 = 0;
              while ((0x20 < (ulong)(byte)pcVar18[uVar15] ||
                     ((0x100002601U >> ((ulong)(byte)pcVar18[uVar15] & 0x3f) & 1) == 0))) {
                uVar15 = uVar15 + 1;
              }
              if (uVar15 == 7) {
                if (*(int *)(pcVar18 + 3) != 0x52492d4c || *(int *)pcVar18 != 0x4c534153)
                goto LAB_004db49c;
                (conn->proto).imapc.ir_supported = true;
                sVar14 = 7;
              }
              else if (uVar15 == 0xd) {
                if (*(long *)(pcVar18 + 5) != 0x44454c4241534944 ||
                    *(long *)pcVar18 != 0x5349444e49474f4c) goto LAB_004db49c;
                (conn->proto).imapc.login_disabled = true;
                sVar14 = 0xd;
              }
              else if ((uVar15 == 8) && (*(long *)pcVar18 == 0x534c545452415453)) {
                (conn->proto).imapc.tls_supported = true;
                sVar14 = 8;
              }
              else {
LAB_004db49c:
                sVar14 = uVar15;
                if ((5 < uVar15) && (pcVar18[4] == 0x3d && *(int *)pcVar18 == 0x48545541)) {
                  pcVar18 = pcVar18 + 5;
                  sVar14 = uVar15 - 5;
                  uVar11 = Curl_sasl_decode_mech(pcVar18,sVar14,&local_68);
                  if ((uVar11 != 0) &&
                     (CONCAT44(local_68._4_4_,(saslprogress)local_68) + 5U == uVar15)) {
                    piVar1 = &(conn->proto).ftpc.diralloc;
                    *piVar1 = *piVar1 | uVar11;
                  }
                }
              }
            }
            if ((0x100002600U >> (uVar15 & 0x3f) & 1) == 0) {
              if (uVar15 != 0) goto LAB_004db409;
              goto LAB_004db61c;
            }
            pcVar18 = pcVar18 + 1;
          } while( true );
        }
LAB_004db6b6:
        CVar10 = imap_perform_authentication(conn);
        break;
      case IMAP_STARTTLS:
        CVar10 = CURLE_NOT_BUILT_IN;
        if (local_74 != 0x4f) {
          if ((conn->data->set).use_ssl == CURLUSESSL_TRY) goto LAB_004db6b6;
          Curl_failf(conn->data,"STARTTLS denied. %c");
LAB_004db366:
          CVar10 = CURLE_USE_SSL_FAILED;
        }
        break;
      default:
        goto switchD_004db28d_caseD_4;
      case IMAP_AUTHENTICATE:
        pSVar17 = conn->data;
        CVar10 = Curl_sasl_continue(local_40,conn,local_74,(saslprogress *)&local_68);
        if (CVar10 == CURLE_OK) {
          if ((saslprogress)local_68 == SASL_IDLE) {
            if (((conn->proto).imapc.login_disabled != false) ||
               ((*(byte *)((long)&conn->proto + 0x98) & 1) == 0)) {
              pcVar18 = "Authentication cancelled";
              goto LAB_004db87b;
            }
            CVar10 = imap_perform_login(conn);
          }
          else {
            CVar10 = CURLE_OK;
            CVar8 = CURLE_OK;
            if ((saslprogress)local_68 == SASL_DONE) goto LAB_004db97d;
          }
        }
        break;
      case IMAP_LOGIN:
        if (local_74 == 0x4f) goto switchD_004db28d_caseD_4;
        Curl_failf(conn->data,"Access denied. %c");
LAB_004db882:
        CVar10 = CURLE_LOGIN_DENIED;
        break;
      case IMAP_LIST:
      case IMAP_SEARCH:
        if (local_74 == 0x4f) goto switchD_004db28d_caseD_4;
        CVar10 = CURLE_QUOTE_ERROR;
        if (local_74 == 0x2a) {
          pSVar17 = conn->data;
          pcVar18 = (pSVar17->state).buffer;
          sVar13 = strlen(pcVar18);
          (pSVar17->state).buffer[sVar13] = '\n';
          CVar10 = Curl_client_write(conn,1,pcVar18,sVar13 + 1);
          (pSVar17->state).buffer[sVar13] = '\0';
        }
        break;
      case IMAP_SELECT:
        pSVar17 = conn->data;
        if (local_74 == 0x4f) {
          pvVar5 = (pSVar17->req).protop;
          if (((*(char **)((long)pvVar5 + 0x10) != (char *)0x0) &&
              (pcVar18 = (conn->proto).imapc.mailbox_uidvalidity, pcVar18 != (char *)0x0)) &&
             (iVar12 = strcmp(*(char **)((long)pvVar5 + 0x10),pcVar18), iVar12 != 0)) {
            Curl_failf(pSVar17,"Mailbox UIDVALIDITY has changed");
            goto LAB_004db693;
          }
          pcVar18 = (*Curl_cstrdup)(*(char **)((long)pvVar5 + 8));
          (conn->proto).imapc.mailbox = pcVar18;
          if (*(long *)((long)pvVar5 + 0x38) == 0) {
            if (*(long *)((long)pvVar5 + 0x30) == 0) {
              CVar10 = imap_perform_fetch(conn);
            }
            else {
              CVar10 = imap_perform_search(conn);
            }
          }
          else {
            CVar10 = imap_perform_list(conn);
          }
        }
        else {
          if (local_74 != 0x2a) {
            pcVar18 = "Select failed";
LAB_004db87b:
            Curl_failf(pSVar17,pcVar18);
            goto LAB_004db882;
          }
          CVar10 = CURLE_OK;
          iVar12 = __isoc99_sscanf((pSVar17->state).buffer + 2,"OK [UIDVALIDITY %19[0123456789]]",
                                   &local_68);
          if (iVar12 == 1) {
            (*Curl_cfree)((conn->proto).imapc.mailbox_uidvalidity);
            (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
            pcVar18 = (*Curl_cstrdup)((char *)&local_68);
            (conn->proto).imapc.mailbox_uidvalidity = pcVar18;
          }
        }
        break;
      case IMAP_FETCH:
        pSVar17 = conn->data;
        if (local_74 == 0x2a) {
          pcVar18 = (pSVar17->state).buffer;
          pcVar16 = (pSVar17->state).buffer;
          while( true ) {
            pcVar16 = pcVar16 + 1;
            bVar3 = pcVar16[-1];
            uVar15 = (ulong)bVar3;
            if (bVar3 == 0) break;
            if (bVar3 == 0x7b) {
              uVar15 = strtol(pcVar16,(char **)&local_68,10);
              pcVar16 = (char *)CONCAT44(local_68._4_4_,(saslprogress)local_68);
              if ((((long)pcVar16 - (long)pcVar18 < 2) || (*pcVar16 != '}')) || (pcVar16[1] != '\r')
                 ) {
                bVar19 = false;
              }
              else {
                bVar19 = pcVar16[2] == '\0';
              }
              goto LAB_004db76c;
            }
            pcVar18 = pcVar18 + 1;
          }
          bVar19 = false;
LAB_004db76c:
          if (bVar19) {
            CVar10 = CURLE_OK;
            Curl_infof(pSVar17,"Found %lu bytes to download\n",uVar15);
            Curl_pgrsSetDownloadSize(pSVar17,uVar15);
            pcVar18 = (pp->ftpc).pp.cache;
            if (pcVar18 != (char *)0x0) {
              local_70 = (conn->proto).ftpc.pp.cache_size;
              if (uVar15 <= local_70) {
                local_70 = uVar15;
              }
              CVar10 = Curl_client_write(conn,1,pcVar18,local_70);
              uVar6 = local_70;
              if (CVar10 != CURLE_OK) break;
              pcVar2 = &(pSVar17->req).bytecount;
              *pcVar2 = *pcVar2 + local_70;
              local_48 = uVar15;
              Curl_infof(pSVar17,"Written %lu bytes, %lu bytes are left for transfer\n");
              uVar7 = local_70;
              uVar15 = (conn->proto).ftpc.pp.cache_size;
              sVar13 = uVar15 - uVar6;
              if (uVar15 < uVar6 || sVar13 == 0) {
                (*Curl_cfree)((pp->ftpc).pp.cache);
                (pp->ftpc).pp.cache = (char *)0x0;
                sVar14 = 0;
              }
              else {
                memmove((conn->proto).generic,(void *)((long)(conn->proto).generic + local_70),
                        sVar13);
                sVar14 = (conn->proto).ftpc.pp.cache_size - uVar7;
              }
              (conn->proto).ftpc.pp.cache_size = sVar14;
              uVar15 = local_48;
            }
            if ((pSVar17->req).bytecount == uVar15) {
              iVar12 = -1;
              uVar15 = 0xffffffffffffffff;
            }
            else {
              (pSVar17->req).maxdownload = uVar15;
              iVar12 = 0;
            }
            writesockindex = -1;
            goto LAB_004db978;
          }
          Curl_failf(((conn->proto).ftpc.pp.conn)->data,"Failed to parse FETCH response.");
          CVar8 = CURLE_FTP_WEIRD_SERVER_REPLY;
LAB_004db97d:
          CVar10 = CVar8;
          (conn->proto).imapc.state = IMAP_STOP;
        }
        else {
          Curl_pgrsSetDownloadSize(pSVar17,-1);
          (conn->proto).imapc.state = IMAP_STOP;
LAB_004db693:
          CVar10 = CURLE_REMOTE_FILE_NOT_FOUND;
        }
        break;
      case IMAP_FETCH_FINAL:
        CVar10 = CURLE_FTP_WEIRD_SERVER_REPLY;
        goto LAB_004db609;
      case IMAP_APPEND:
        CVar10 = CURLE_UPLOAD_FAILED;
        if (local_74 == 0x2b) {
          Curl_pgrsSetUploadSize(conn->data,(conn->data->state).infilesize);
          CVar10 = CURLE_OK;
          iVar12 = -1;
          uVar15 = 0xffffffffffffffff;
          writesockindex = 0;
LAB_004db978:
          Curl_setup_transfer(conn,iVar12,uVar15,false,(curl_off_t *)0x0,writesockindex,
                              (curl_off_t *)0x0);
          CVar8 = CVar10;
          goto LAB_004db97d;
        }
        break;
      case IMAP_APPEND_FINAL:
        CVar10 = CURLE_UPLOAD_FAILED;
LAB_004db609:
        if (local_74 == 0x4f) {
switchD_004db28d_caseD_4:
          (conn->proto).imapc.state = IMAP_STOP;
LAB_004db61c:
          CVar10 = CURLE_OK;
        }
      }
      if (CVar10 != CURLE_OK) {
        return CVar10;
      }
      if ((conn->proto).imapc.state == IMAP_STOP) {
        return CURLE_OK;
      }
      _Var9 = Curl_pp_moredata(&(pp->ftpc).pp);
      if (!_Var9) {
        return CURLE_OK;
      }
    }
  }
  return CVar10;
}

Assistant:

static CURLcode imap_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int imapcode;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not IMAP */
  if(imapc->state == IMAP_UPGRADETLS)
    return imap_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &imapcode, &nread);
    if(result)
      return result;

    /* Was there an error parsing the response line? */
    if(imapcode == -1)
      return CURLE_FTP_WEIRD_SERVER_REPLY;

    if(!imapcode)
      break;

    /* We have now received a full IMAP server response */
    switch(imapc->state) {
    case IMAP_SERVERGREET:
      result = imap_state_servergreet_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_CAPABILITY:
      result = imap_state_capability_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_STARTTLS:
      result = imap_state_starttls_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE:
      result = imap_state_auth_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGIN:
      result = imap_state_login_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LIST:
      result = imap_state_list_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SELECT:
      result = imap_state_select_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH:
      result = imap_state_fetch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH_FINAL:
      result = imap_state_fetch_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND:
      result = imap_state_append_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND_FINAL:
      result = imap_state_append_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SEARCH:
      result = imap_state_search_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGOUT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, IMAP_STOP);
      break;
    }
  } while(!result && imapc->state != IMAP_STOP && Curl_pp_moredata(pp));

  return result;
}